

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_id_list_around_both
          (REF_CELL ref_cell_a,REF_CELL ref_cell_b,REF_INT node,REF_INT max_ids,REF_INT *n_ids,
          REF_INT *ids)

{
  bool bVar1;
  uint uVar2;
  REF_INT local_e8;
  REF_INT local_e4;
  int local_e0;
  REF_INT local_dc;
  REF_INT local_d8;
  int local_d4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL ref_cell;
  REF_INT local_b8;
  REF_BOOL already_have_it;
  REF_INT nodes [27];
  REF_INT deg;
  REF_INT id;
  REF_INT cell;
  REF_INT item;
  REF_INT *ids_local;
  REF_INT *n_ids_local;
  REF_INT max_ids_local;
  REF_INT node_local;
  REF_CELL ref_cell_b_local;
  REF_CELL ref_cell_a_local;
  
  *n_ids = 0;
  if ((node < 0) || (ref_cell_a->ref_adj->nnode <= node)) {
    local_d4 = -1;
  }
  else {
    local_d4 = ref_cell_a->ref_adj->first[node];
  }
  id = local_d4;
  if (local_d4 == -1) {
    local_d8 = -1;
  }
  else {
    local_d8 = ref_cell_a->ref_adj->item[local_d4].ref;
  }
  deg = local_d8;
  while (id != -1) {
    uVar2 = ref_cell_nodes(ref_cell_a,deg,&local_b8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x51a,
             "ref_cell_id_list_around_both",(ulong)uVar2,"nodes");
      return uVar2;
    }
    bVar1 = false;
    for (nodes[0x1a] = 0; nodes[0x1a] < *n_ids; nodes[0x1a] = nodes[0x1a] + 1) {
      if ((&local_b8)[ref_cell_a->node_per] == ids[nodes[0x1a]]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      if (max_ids <= *n_ids) {
        return 7;
      }
      ids[*n_ids] = (&local_b8)[ref_cell_a->node_per];
      *n_ids = *n_ids + 1;
    }
    id = ref_cell_a->ref_adj->item[id].next;
    if (id == -1) {
      local_dc = -1;
    }
    else {
      local_dc = ref_cell_a->ref_adj->item[id].ref;
    }
    deg = local_dc;
  }
  if ((node < 0) || (ref_cell_b->ref_adj->nnode <= node)) {
    local_e0 = -1;
  }
  else {
    local_e0 = ref_cell_b->ref_adj->first[node];
  }
  id = local_e0;
  if (local_e0 == -1) {
    local_e4 = -1;
  }
  else {
    local_e4 = ref_cell_b->ref_adj->item[local_e0].ref;
  }
  deg = local_e4;
  while( true ) {
    if (id == -1) {
      return 0;
    }
    uVar2 = ref_cell_nodes(ref_cell_b,deg,&local_b8);
    if (uVar2 != 0) break;
    bVar1 = false;
    for (nodes[0x1a] = 0; nodes[0x1a] < *n_ids; nodes[0x1a] = nodes[0x1a] + 1) {
      if ((&local_b8)[ref_cell_b->node_per] == ids[nodes[0x1a]]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      if (max_ids <= *n_ids) {
        return 7;
      }
      ids[*n_ids] = (&local_b8)[ref_cell_b->node_per];
      *n_ids = *n_ids + 1;
    }
    id = ref_cell_b->ref_adj->item[id].next;
    if (id == -1) {
      local_e8 = -1;
    }
    else {
      local_e8 = ref_cell_b->ref_adj->item[id].ref;
    }
    deg = local_e8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x52a,
         "ref_cell_id_list_around_both",(ulong)uVar2,"nodes");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around_both(REF_CELL ref_cell_a,
                                                REF_CELL ref_cell_b,
                                                REF_INT node, REF_INT max_ids,
                                                REF_INT *n_ids, REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;
  REF_CELL ref_cell;

  *n_ids = 0;

  ref_cell = ref_cell_a;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  ref_cell = ref_cell_b;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}